

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O3

void deqp::egl::anon_unknown_4::finish(Functions *gl,EGLint api)

{
  NotSupportedError *this;
  string local_40;
  
  if ((api != 0x40) && (api != 4)) {
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Unsupported API","");
    tcu::NotSupportedError::NotSupportedError(this,&local_40);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (*(code *)gl)();
  return;
}

Assistant:

static void finish (const glw::Functions& gl, EGLint api)
{
	switch (api)
	{
		case EGL_OPENGL_ES2_BIT:
		case EGL_OPENGL_ES3_BIT_KHR:
			gl.finish();
			break;

		default:
			throw tcu::NotSupportedError("Unsupported API");
	}
}